

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O1

complex<double> CRange::lngamma<double>(complex<double> *z)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar4;
  long lVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  double dVar7;
  double __y;
  double dVar8;
  double dVar9;
  complex<double> cVar10;
  
  dVar2 = *(double *)z->_M_value;
  __y = *(double *)(z->_M_value + 8);
  dVar7 = -dVar2;
  if (dVar2 <= dVar7) {
    __y = -__y;
  }
  dVar3 = (double)(-(ulong)(dVar7 < dVar2) & (ulong)(dVar2 + -1.0) |
                  ~-(ulong)(dVar7 < dVar2) & (ulong)dVar7);
  dVar2 = dVar3 + 5.5;
  dVar7 = dVar2 * dVar2 + __y * __y;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  log(dVar7);
  atan2(__y,dVar2);
  log(dVar7);
  atan2(__y,dVar2);
  dVar7 = 1.000000000190015;
  lVar5 = 0;
  dVar2 = 0.0;
  do {
    pdVar1 = lngamma<double>::coeff + lVar5;
    lVar5 = lVar5 + 1;
    dVar9 = (double)(int)lVar5 + dVar3;
    dVar8 = *pdVar1 / (dVar9 * dVar9 + __y * __y);
    dVar2 = dVar2 + dVar8;
    dVar7 = dVar7 + dVar8 * dVar9;
  } while (lVar5 != 6);
  dVar2 = dVar2 * -__y;
  atan2(dVar2,dVar7);
  log(dVar2 * dVar2 + dVar7 * dVar7);
  uVar4 = extraout_RAX;
  uVar6 = extraout_RDX;
  if (*(double *)z->_M_value < 0.0) {
    dVar2 = csin(*(double *)z->_M_value * 3.141592653589793);
    clog(dVar2);
    uVar4 = extraout_RAX_00;
    uVar6 = extraout_RDX_00;
  }
  cVar10._M_value._8_8_ = uVar6;
  cVar10._M_value._0_8_ = uVar4;
  return (complex<double>)cVar10._M_value;
}

Assistant:

std::complex<T> lngamma( const std::complex<T> &z )
    {
        const static T coeff[6] = {76.18009172947146,
            -86.50532032941677,
            24.01409824083091,
            -1.231739572450155,
            0.1208650973866179e-2,
            -0.5395239384953e-5};
        T x, y;
        if(z.real() > 0) {
            x=z.real()-1.0;
            y=z.imag();
        } else {
            x=-z.real();
            y=-z.imag();
        }
        T r = sqrt((x+5.5)*(x+5.5)+y*y);
        T aterm1=y*log(r);
        T aterm2=(x+0.5)*atan2(y,(x+5.5))-y;
        T lterm1=(x+0.5)*log(r);
        T lterm2=-y*atan2(y,(x+5.5)) - (x+5.5) + 0.5*log(2.0*M_PI);
        T num=0.0;
        T denom=1.000000000190015;
        for(int j=1;j<7;j++){
            T fj=(T)j;
            T cterm=coeff[j-1]/((x+fj)*(x+fj)+y*y);
            num+=cterm;
            denom+=(x+fj)*cterm;
        }
        num*=-y;
        T aterm3=atan2(num,denom);
        T lterm3 = 0.5*log(num*num + denom*denom);
        std::complex<T> result(lterm1+lterm2+lterm3,aterm1+aterm2+aterm3);
        if(z.real() < 0){
            std::complex<T> lpi(log(M_PI), 0.0);
            result = lpi - (result + std::log(std::sin(M_PI*z)));
        }
        return(result);
    }